

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::short_level_formatter<spdlog::details::null_scoped_padder>::format
          (short_level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2
          ,memory_buf_t *dest)

{
  fmt_helper *this_00;
  char *pcVar1;
  undefined1 *dest_00;
  string_view_t view;
  
  dest_00 = level::short_level_names;
  this_00 = *(fmt_helper **)(level::short_level_names + (ulong)msg->level * 8);
  pcVar1 = (char *)strlen((char *)this_00);
  view.size_ = (size_t)dest;
  view.data_ = pcVar1;
  fmt_helper::append_string_view(this_00,view,(memory_buf_t *)dest_00);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }